

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_splittingstep.c
# Opt level: O0

void splittingStep_Free(ARKodeMem ark_mem)

{
  long in_RDI;
  ARKodeSplittingStepMem step_mem;
  SplittingStepCoefficients *coefficients;
  
  coefficients = *(SplittingStepCoefficients **)(in_RDI + 0x88);
  if (coefficients != (SplittingStepCoefficients *)0x0) {
    if (*coefficients != (SplittingStepCoefficients)0x0) {
      free(*coefficients);
    }
    if (coefficients[2] != (SplittingStepCoefficients)0x0) {
      free(coefficients[2]);
    }
    SplittingStepCoefficients_Destroy(coefficients);
    free(coefficients);
  }
  *(undefined8 *)(in_RDI + 0x88) = 0;
  return;
}

Assistant:

static void splittingStep_Free(ARKodeMem ark_mem)
{
  ARKodeSplittingStepMem step_mem = (ARKodeSplittingStepMem)ark_mem->step_mem;
  if (step_mem != NULL)
  {
    if (step_mem->steppers != NULL) { free(step_mem->steppers); }
    if (step_mem->n_stepper_evolves != NULL)
    {
      free(step_mem->n_stepper_evolves);
    }
    SplittingStepCoefficients_Destroy(&step_mem->coefficients);
    free(step_mem);
  }
  ark_mem->step_mem = NULL;
}